

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeTypedArrayPrototype
               (DynamicObject *typedarrayPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  Type *addr;
  Type *addr_00;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  RuntimeFunction *pRVar3;
  undefined4 *puVar4;
  JavascriptFunction *pJVar5;
  
  DeferredTypeHandlerBase::Convert(typeHandler,typedarrayPrototype,mode,0x1f,0);
  this = (((typedarrayPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this_00);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Array_prototype,this_00);
  }
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x67,(this->super_JavascriptLibraryBase).typedArrayConstructor.ptr,
             6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Set,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x19b);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x19b,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Subarray,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x1cb);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x1cb,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::At,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x51);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x51,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::CopyWithin,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,99);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,99,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Every,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x82);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x82,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Fill,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x88);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x88,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Filter,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x89);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x89,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Find,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x8b);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x8b,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::FindIndex,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x8c);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x8c,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::ForEach,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x93);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x93,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::IndexOf,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0xb9);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0xb9,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Join,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xcc);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0xcc,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::LastIndexOf,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xd0);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0xd0,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Map,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xd5);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0xd5,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Reduce,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,300);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,300,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::ReduceRight,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x12d);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x12d,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Reverse,0,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x136);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x136,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Slice,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x150);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x150,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Some,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x151);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x151,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Sort,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x152);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x152,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Entries,0,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x7a);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x7a,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Keys,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xcf);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0xcf,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Values,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,399);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,399,pRVar3,6,0,0,0);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0x14,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)TypedArrayBase::EntryInfo::Includes,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xb8);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (typedarrayPrototype,0xb8,pRVar3,6,0,0,0);
  pRVar3 = CreateGetterFunction(this,0x1aa,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterBuffer);
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (typedarrayPrototype,0x1aa,pRVar3);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(typedarrayPrototype,0x1aa,6);
  pRVar3 = CreateGetterFunction
                     (this,0x1a9,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterByteLength);
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (typedarrayPrototype,0x1a9,pRVar3);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(typedarrayPrototype,0x1a9,6);
  pRVar3 = CreateGetterFunction
                     (this,0x1a8,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterByteOffset);
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (typedarrayPrototype,0x1a8,pRVar3);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(typedarrayPrototype,0x1a8,6);
  pRVar3 = CreateGetterFunction(this,0xd1,(FunctionInfo *)TypedArrayBase::EntryInfo::GetterLength);
  if (pRVar3 == (RuntimeFunction *)0x0) {
    pRVar3 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (typedarrayPrototype,0xd1,pRVar3);
  (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(typedarrayPrototype,0xd1,6);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    pRVar3 = CreateGetterFunction
                       (this,0x2c3,
                        (FunctionInfo *)TypedArrayBase::EntryInfo::GetterSymbolToStringTag);
    if (pRVar3 == (RuntimeFunction *)0x0) {
      pRVar3 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
              (typedarrayPrototype,0x1b,pRVar3);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])(typedarrayPrototype,0x1b,6);
  }
  addr = &this->arrayPrototypeToStringFunction;
  addr_00 = &this->arrayPrototypeToLocaleStringFunction;
  pJVar5 = (this->arrayPrototypeToLocaleStringFunction).ptr;
  if ((this->arrayPrototypeToStringFunction).ptr == (JavascriptFunction *)0x0) {
    if (pJVar5 != (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x95a,
                                  "(library->arrayPrototypeToLocaleStringFunction == nullptr)",
                                  "library->arrayPrototypeToLocaleStringFunction == nullptr");
      if (!bVar2) goto LAB_00bdc27c;
      *puVar4 = 0;
    }
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::ToLocaleString,0,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x172);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x172,pRVar3,6,0,0,0);
    Memory::Recycler::WBSetBit((char *)addr_00);
    (this->arrayPrototypeToLocaleStringFunction).ptr = &pRVar3->super_JavascriptFunction;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::ToString,0,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x178);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x178,pRVar3,6,0,0,0);
    Memory::Recycler::WBSetBit((char *)addr);
    (this->arrayPrototypeToStringFunction).ptr = &pRVar3->super_JavascriptFunction;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else {
    if (pJVar5 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x961,"(library->arrayPrototypeToLocaleStringFunction)",
                                  "library->arrayPrototypeToLocaleStringFunction");
      if (!bVar2) {
LAB_00bdc27c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pJVar5 = addr_00->ptr;
    }
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x172,pJVar5,6,0,0,0);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x178,addr->ptr,6,0,0,0);
  }
  if (((this_00->config).threadConfig)->m_ESArrayFindFromLast == true) {
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)TypedArrayBase::EntryInfo::FindLast,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x8d);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x8d,pRVar3,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)TypedArrayBase::EntryInfo::FindLastIndex,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x8e);
    (*(typedarrayPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (typedarrayPrototype,0x8e,pRVar3,6,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(typedarrayPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeTypedArrayPrototype(DynamicObject* typedarrayPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(typedarrayPrototype, mode, 31);

        ScriptContext* scriptContext = typedarrayPrototype->GetScriptContext();
        JavascriptLibrary* library = typedarrayPrototype->GetLibrary();

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
        }
#endif

        library->AddMember(typedarrayPrototype, PropertyIds::constructor, library->typedArrayConstructor);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::set, &TypedArrayBase::EntryInfo::Set, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::subarray, &TypedArrayBase::EntryInfo::Subarray, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::at, &TypedArrayBase::EntryInfo::At, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::copyWithin, &TypedArrayBase::EntryInfo::CopyWithin, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::every, &TypedArrayBase::EntryInfo::Every, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::fill, &TypedArrayBase::EntryInfo::Fill, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::filter, &TypedArrayBase::EntryInfo::Filter, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::find, &TypedArrayBase::EntryInfo::Find, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findIndex, &TypedArrayBase::EntryInfo::FindIndex, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::forEach, &TypedArrayBase::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::indexOf, &TypedArrayBase::EntryInfo::IndexOf, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::join, &TypedArrayBase::EntryInfo::Join, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::lastIndexOf, &TypedArrayBase::EntryInfo::LastIndexOf, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::map, &TypedArrayBase::EntryInfo::Map, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reduce, &TypedArrayBase::EntryInfo::Reduce, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reduceRight, &TypedArrayBase::EntryInfo::ReduceRight, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::reverse, &TypedArrayBase::EntryInfo::Reverse, 0);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::slice, &TypedArrayBase::EntryInfo::Slice, 2);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::some, &TypedArrayBase::EntryInfo::Some, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::sort, &TypedArrayBase::EntryInfo::Sort, 1);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::entries, &TypedArrayBase::EntryInfo::Entries, 0);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::keys, &TypedArrayBase::EntryInfo::Keys, 0);
        JavascriptFunction* valuesFunc = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::values, &TypedArrayBase::EntryInfo::Values, 0);
        library->AddMember(typedarrayPrototype, PropertyIds::_symbolIterator, valuesFunc);
        library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::includes, &TypedArrayBase::EntryInfo::Includes, 1);

        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::buffer, &TypedArrayBase::EntryInfo::GetterBuffer, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::byteLength, &TypedArrayBase::EntryInfo::GetterByteLength, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::byteOffset, &TypedArrayBase::EntryInfo::GetterByteOffset, nullptr);
        library->AddAccessorsToLibraryObject(typedarrayPrototype, PropertyIds::length, &TypedArrayBase::EntryInfo::GetterLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            // ES2017 22.2.3.32 get %TypedArray%.prototype[@@toStringTag]
            // %TypedArray%.prototype[@@toStringTag] is an accessor property whose set accessor function is undefined.
            // This property has the attributes { [[Enumerable]]: false, [[Configurable]]: true }.
            // The initial value of the name property of this function is "get [Symbol.toStringTag]".
            library->AddAccessorsToLibraryObjectWithName(typedarrayPrototype, PropertyIds::_symbolToStringTag,
                PropertyIds::_RuntimeFunctionNameId_toStringTag, &TypedArrayBase::EntryInfo::GetterSymbolToStringTag, nullptr);
        }
        // The toString and toLocaleString properties are shared between Array.prototype and %TypedArray%.prototype.
        // Whichever prototype is initialized first will create the functions, the other should just load the existing function objects.
        if (library->arrayPrototypeToStringFunction == nullptr)
        {
            Assert(library->arrayPrototypeToLocaleStringFunction == nullptr);

            library->arrayPrototypeToLocaleStringFunction = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::toLocaleString, &JavascriptArray::EntryInfo::ToLocaleString, 0);
            library->arrayPrototypeToStringFunction = library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::toString, &JavascriptArray::EntryInfo::ToString, 0);
        }
        else
        {
            Assert(library->arrayPrototypeToLocaleStringFunction);

            library->AddMember(typedarrayPrototype, PropertyIds::toLocaleString, library->arrayPrototypeToLocaleStringFunction);
            library->AddMember(typedarrayPrototype, PropertyIds::toString, library->arrayPrototypeToStringFunction);
        }

        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled()) {
            library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findLast, &TypedArrayBase::EntryInfo::FindLast, 1);
            library->AddFunctionToLibraryObject(typedarrayPrototype, PropertyIds::findLastIndex, &TypedArrayBase::EntryInfo::FindLastIndex, 1);
        }

        typedarrayPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }